

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O2

_Bool duckdb_je_pa_shrink(tsdn_t *tsdn,pa_shard_t *shard,edata_t *edata,size_t old_size,
                         size_t new_size,szind_t szind,_Bool *deferred_work_generated)

{
  _Bool _Var1;
  uint uVar2;
  _Bool _Var3;
  pai_t *ppVar4;
  
  _Var3 = true;
  uVar2 = (uint)edata->e_bits;
  if ((uVar2 >> 0x10 & 1) == 0) {
    ppVar4 = &(shard->hpa_sec).pai;
    if ((uVar2 >> 0xe & 1) == 0) {
      ppVar4 = &(shard->pac).pai;
    }
    _Var1 = (*ppVar4->shrink)(tsdn,ppVar4,edata,old_size,new_size,deferred_work_generated);
    if (!_Var1) {
      LOCK();
      (shard->nactive).repr = (shard->nactive).repr - (old_size - new_size >> 0xc);
      UNLOCK();
      edata->e_bits = (ulong)szind << 0x14 | edata->e_bits & 0xfffffffff00fffff;
      _Var3 = false;
      duckdb_je_emap_remap(tsdn,shard->emap,edata,szind,false);
    }
  }
  return _Var3;
}

Assistant:

bool
pa_shrink(tsdn_t *tsdn, pa_shard_t *shard, edata_t *edata, size_t old_size,
    size_t new_size, szind_t szind, bool *deferred_work_generated) {
	assert(new_size < old_size);
	assert(edata_size_get(edata) == old_size);
	assert((new_size & PAGE_MASK) == 0);
	if (edata_guarded_get(edata)) {
		return true;
	}
	size_t shrink_amount = old_size - new_size;

	pai_t *pai = pa_get_pai(shard, edata);
	bool error = pai_shrink(tsdn, pai, edata, old_size, new_size,
	    deferred_work_generated);
	if (error) {
		return true;
	}
	pa_nactive_sub(shard, shrink_amount >> LG_PAGE);

	edata_szind_set(edata, szind);
	emap_remap(tsdn, shard->emap, edata, szind, /* slab */ false);
	return false;
}